

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void f_xtra_act(keypress ch,wchar_t oid)

{
  wchar_t oid_local;
  undefined4 uStack_10;
  keypress ch_local;
  
  uStack_10 = ch.code;
  if (uStack_10 == 0x74) {
    if (f_uik_lighting == LIGHTING_LOS) {
      f_uik_lighting = LIGHTING_DARK;
    }
    else if (f_uik_lighting == LIGHTING_TORCH) {
      f_uik_lighting = LIGHTING_LOS;
    }
    else if (f_uik_lighting == LIGHTING_LIT) {
      f_uik_lighting = LIGHTING_TORCH;
    }
    else {
      f_uik_lighting = LIGHTING_LIT;
    }
  }
  else if (uStack_10 == 0x54) {
    if (f_uik_lighting == LIGHTING_LOS) {
      f_uik_lighting = LIGHTING_TORCH;
    }
    else if (f_uik_lighting == LIGHTING_LIT) {
      f_uik_lighting = LIGHTING_DARK;
    }
    else if (f_uik_lighting == LIGHTING_DARK) {
      f_uik_lighting = LIGHTING_LOS;
    }
    else {
      f_uik_lighting = LIGHTING_LIT;
    }
  }
  return;
}

Assistant:

static void f_xtra_act(struct keypress ch, int oid)
{
	/* XXX must be a better way to cycle this */
	if (ch.code == 't') {
		switch (f_uik_lighting) {
				case LIGHTING_LIT:  f_uik_lighting = LIGHTING_TORCH; break;
                case LIGHTING_TORCH: f_uik_lighting = LIGHTING_LOS; break;
				case LIGHTING_LOS:  f_uik_lighting = LIGHTING_DARK; break;
				default:	f_uik_lighting = LIGHTING_LIT; break;
		}		
	} else if (ch.code == 'T') {
		switch (f_uik_lighting) {
				case LIGHTING_DARK:  f_uik_lighting = LIGHTING_LOS; break;
                case LIGHTING_LOS: f_uik_lighting = LIGHTING_TORCH; break;
				case LIGHTING_LIT:  f_uik_lighting = LIGHTING_DARK; break;
				default:	f_uik_lighting = LIGHTING_LIT; break;
		}
	}
	
}